

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  fpclass_type fVar1;
  int32_t iVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  fpclass_type fVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxId *pSVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  bool *pbVar14;
  long lVar15;
  int iVar16;
  int *piVar17;
  int *piVar18;
  long lVar19;
  pointer pnVar20;
  cpp_dec_float<200u,int,void> *pcVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  undefined4 *puVar23;
  uint *puVar24;
  undefined4 *puVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  uint *puVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  uint *puVar29;
  undefined4 *puVar30;
  cpp_dec_float<200U,_int,_void> *pcVar31;
  byte bVar32;
  long lVar33;
  cpp_dec_float<200u,int,void> *this_00;
  pointer pnVar34;
  long in_FS_OFFSET;
  byte bVar35;
  ulong uVar36;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [13];
  undefined3 uStack_45b;
  int iStack_458;
  bool bStack_454;
  ulong local_450;
  int local_444;
  pointer local_440;
  cpp_dec_float<200U,_int,_void> *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  undefined1 local_428 [32];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [13];
  undefined3 uStack_3bb;
  int iStack_3b8;
  bool abStack_3b4 [4];
  ulong local_3b0;
  pointer local_3a8;
  Type local_39c;
  undefined1 local_398 [32];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [13];
  undefined3 uStack_32b;
  int iStack_328;
  bool bStack_324;
  undefined8 local_320;
  double local_318;
  undefined8 uStack_310;
  fpclass_type *local_308;
  fpclass_type *local_300;
  pointer local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [13];
  undefined3 uStack_27b;
  int iStack_278;
  bool bStack_274;
  undefined8 local_270;
  cpp_dec_float<200U,_int,_void> local_268;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [13];
  undefined3 uStack_17b;
  int iStack_178;
  bool bStack_174;
  fpclass_type local_170;
  int32_t iStack_16c;
  double local_168;
  undefined8 uStack_160;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_158;
  undefined8 uStack_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  bVar35 = 0;
  local_3b0._0_4_ = cpp_dec_float_finite;
  local_3b0._4_4_ = 0x1c;
  local_428._0_16_ = (undefined1  [16])0x0;
  local_428._16_16_ = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  local_3c8 = SUB1613((undefined1  [16])0x0,0);
  uStack_3bb = 0;
  iStack_3b8 = 0;
  abStack_3b4[0] = false;
  local_270._0_4_ = cpp_dec_float_finite;
  local_270._4_4_ = 0x1c;
  local_2e8._0_16_ = (undefined1  [16])0x0;
  local_2e8._16_16_ = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = SUB1613((undefined1  [16])0x0,0);
  uStack_27b = 0;
  iStack_278 = 0;
  bStack_274 = false;
  local_1e8._0_16_ = (undefined1  [16])0x0;
  local_1e8._16_16_ = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = SUB1613((undefined1  [16])0x0,0);
  uStack_17b = 0;
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8._0_16_ = (undefined1  [16])0x0;
  local_b8._16_16_ = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  local_c0._0_4_ = cpp_dec_float_finite;
  local_c0._4_4_ = 0x1c;
  local_138._0_16_ = (undefined1  [16])0x0;
  local_138._16_16_ = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = SUB1613((undefined1  [16])0x0,0);
  local_2f0 = 0;
  uStack_cb = 0;
  iStack_c8 = 0;
  bStack_c4 = false;
  local_39c = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_39c != LEAVE) {
    pSVar6 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_2f0 = CONCAT71((int7)((ulong)pSVar6 >> 8),pSVar6->theRep == ROW);
  }
  puVar27 = (uint *)maxabs;
  pcVar26 = &local_268;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pcVar26->data)._M_elems[0] = *puVar27;
    puVar27 = puVar27 + 1;
    pcVar26 = (cpp_dec_float<200U,_int,_void> *)((pcVar26->data)._M_elems + 1);
  }
  local_268.exp = (maxabs->m_backend).exp;
  local_268.neg = (maxabs->m_backend).neg;
  local_268.fpclass = (maxabs->m_backend).fpclass;
  local_268.prec_elem = (maxabs->m_backend).prec_elem;
  local_308 = (fpclass_type *)
              (upBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_300 = (fpclass_type *)
              (lowBound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3a8 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar18 = (update->thedelta).super_IdxSet.idx;
  pnVar34 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar27 = (uint *)val;
  puVar24 = (uint *)local_1e8;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar24 = *puVar27;
    puVar27 = puVar27 + 1;
    puVar24 = puVar24 + 1;
  }
  iStack_178 = (val->m_backend).exp;
  bStack_174 = (val->m_backend).neg;
  local_170 = (val->m_backend).fpclass;
  iStack_16c = (val->m_backend).prec_elem;
  local_440 = pnVar34;
  local_140 = maxabs;
  local_148 = val;
  if ((update->thedelta).setupStatus == true) {
    iVar12 = (update->thedelta).super_IdxSet.num;
    local_444 = -1;
    if (start < iVar12) {
      local_430 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(piVar18 + iVar12);
      piVar18 = piVar18 + start;
      local_168 = *(double *)(in_FS_OFFSET + -8);
      uStack_160 = 0;
      local_158 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)-*(double *)(in_FS_OFFSET + -8);
      uStack_150 = 0x8000000000000000;
      local_438 = &(this->fastDelta).m_backend;
      local_2f8 = (pointer)((long)incr << 2);
      local_444 = -1;
      do {
        iVar12 = *piVar18;
        pnVar20 = pnVar34 + iVar12;
        puVar23 = (undefined4 *)local_428;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar23 = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar35 * -2 + 1) * 4);
          puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
        }
        iStack_3b8 = pnVar34[iVar12].m_backend.exp;
        abStack_3b4[0] = pnVar34[iVar12].m_backend.neg;
        local_3b0._0_4_ = pnVar34[iVar12].m_backend.fpclass;
        local_3b0._4_4_ = pnVar34[iVar12].m_backend.prec_elem;
        if (local_39c == LEAVE) {
          if (this->iscoid == true) {
            pSVar6 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar16 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat)->data[iVar12];
          }
          else {
            pSVar6 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar16 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat)->data[iVar12];
          }
          if (iVar16 < 1) goto LAB_005cad94;
          goto LAB_005cb37f;
        }
LAB_005cad94:
        if ((char)local_2f0 != '\0') {
          pSVar6 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar7 = (pSVar6->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar7[iVar12].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)local_4c8,pSVar7 + iVar12);
            iVar16 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar6->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_4c8);
            pnVar34 = local_440;
            if ((pSVar6->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar16] == P_FIXED) goto LAB_005cb37f;
          }
        }
        pnVar22 = &this->epsilon;
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        }
        iStack_458 = (this->epsilon).m_backend.exp;
        bStack_454 = (this->epsilon).m_backend.neg;
        local_450._0_4_ = (this->epsilon).m_backend.fpclass;
        local_450._4_4_ = (this->epsilon).m_backend.prec_elem;
        if ((fpclass_type)local_450 == cpp_dec_float_NaN ||
            (fpclass_type)local_3b0 == cpp_dec_float_NaN) {
LAB_005cb0e0:
          pnVar22 = &this->epsilon;
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
          for (lVar13 = 0x1c; pnVar34 = local_440, lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
          }
          bStack_454 = (this->epsilon).m_backend.neg;
          iStack_458 = (this->epsilon).m_backend.exp;
          fVar3 = (this->epsilon).m_backend.fpclass;
          iVar8 = (this->epsilon).m_backend.prec_elem;
          local_450._0_4_ = fVar3;
          local_450._4_4_ = iVar8;
          if (local_4c8._0_4_ != 0 || fVar3 != cpp_dec_float_finite) {
            bStack_454 = (bool)(bStack_454 ^ 1);
          }
          if ((fVar3 != cpp_dec_float_NaN) && ((fpclass_type)local_3b0 != cpp_dec_float_NaN)) {
            local_318 = (double)CONCAT44(local_318._4_4_,iVar12);
            iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_428,
                                (cpp_dec_float<200U,_int,_void> *)local_4c8);
            if (iVar16 < 0) {
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_428;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar28->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
              }
              iStack_458 = iStack_3b8;
              bStack_454 = abStack_3b4[0];
              local_450 = local_3b0;
              if (local_4c8._0_4_ != 0 || (int)local_3b0 != 0) {
                bStack_454 = (bool)(abStack_3b4[0] ^ 1);
              }
              if ((((int)local_3b0 == 2) || (local_268.fpclass == cpp_dec_float_NaN)) ||
                 (iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_268),
                 iVar16 < 1)) {
                puVar27 = local_268.data._M_elems + 1;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar13 = 0x1b; iVar16 = local_268.exp, bVar32 = local_268.neg,
                    uVar36 = local_268._120_8_, lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar26->data)._M_elems[0] = *puVar27;
                  puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                }
              }
              else {
                puVar27 = (uint *)(local_428 + 4);
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar26->data)._M_elems[0] = *puVar27;
                  puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                }
                local_268.data._M_elems[0] = local_428._0_4_;
                iVar16 = iStack_3b8;
                bVar32 = ((int)local_3b0 != 0 || local_428._0_4_ != 0) ^ abStack_3b4[0];
                uVar36 = local_3b0;
              }
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_398;
              puVar27 = local_268.data._M_elems + 1;
              for (lVar13 = 0x1b; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar27 = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
              }
              pnVar20 = (pointer)((long)local_308 + (long)iVar12 * 0x80);
              puVar23 = (undefined4 *)local_b8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                *puVar23 = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar35 * -2 + 1) * 4);
                puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
              }
              iStack_48 = (((pointer)((long)local_308 + (long)iVar12 * 0x80))->m_backend).exp;
              bStack_44 = (((pointer)((long)local_308 + (long)iVar12 * 0x80))->m_backend).neg;
              local_40._0_4_ =
                   (((pointer)((long)local_308 + (long)iVar12 * 0x80))->m_backend).fpclass;
              local_40._4_4_ =
                   (((pointer)((long)local_308 + (long)iVar12 * 0x80))->m_backend).prec_elem;
              local_268.exp = iVar16;
              local_268.neg = (bool)bVar32;
              local_268._120_8_ = uVar36;
              ::soplex::infinity::__tls_init();
              local_450._0_4_ = cpp_dec_float_finite;
              local_450._4_4_ = 0x1c;
              local_4c8._0_16_ = (undefined1  [16])0x0;
              local_4c8._16_16_ = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_488 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              local_468 = SUB1613((undefined1  [16])0x0,0);
              uStack_45b = 0;
              iStack_458 = 0;
              bStack_454 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_4c8,local_168);
              if (((fpclass_type)local_40 != cpp_dec_float_NaN) &&
                 ((fpclass_type)local_450 != cpp_dec_float_NaN)) {
                iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_b8,
                                    (cpp_dec_float<200U,_int,_void> *)local_4c8);
                if (iVar16 < 0) {
                  pcVar26 = &local_3a8[iVar12].m_backend;
                  local_450._0_4_ = cpp_dec_float_finite;
                  local_450._4_4_ = 0x1c;
                  local_4c8._0_16_ = (undefined1  [16])0x0;
                  local_4c8._16_16_ = (undefined1  [16])0x0;
                  local_4a8 = (undefined1  [16])0x0;
                  local_498 = (undefined1  [16])0x0;
                  local_488 = (undefined1  [16])0x0;
                  local_478 = (undefined1  [16])0x0;
                  local_468 = SUB1613((undefined1  [16])0x0,0);
                  uStack_45b = 0;
                  iStack_458 = 0;
                  bStack_454 = false;
                  if ((cpp_dec_float<200U,_int,_void> *)local_4c8 == pcVar26) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_4c8,
                               (cpp_dec_float<200U,_int,_void> *)local_b8);
                    if (local_4c8._0_4_ != 0 || (fpclass_type)local_450 != cpp_dec_float_finite) {
                      bStack_454 = (bool)(bStack_454 ^ 1);
                    }
                  }
                  else {
                    puVar27 = (uint *)local_b8;
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
                    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                      (pcVar28->data)._M_elems[0] = *puVar27;
                      puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_458 = iStack_48;
                    bStack_454 = bStack_44;
                    local_450._0_4_ = (fpclass_type)local_40;
                    local_450._4_4_ = local_40._4_4_;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              ((cpp_dec_float<200U,_int,_void> *)local_4c8,pcVar26);
                  }
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
                  puVar27 = (uint *)local_2e8;
                  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                    *puVar27 = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                  }
                  iStack_278 = iStack_458;
                  bStack_274 = bStack_454;
                  local_270._0_4_ = (fpclass_type)local_450;
                  local_270._4_4_ = local_450._4_4_;
                  iVar12 = local_318._0_4_;
                  if ((fpclass_type)local_450 != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>
                              ((cpp_dec_float<200U,_int,_void> *)local_4c8,0,(type *)0x0);
                    iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                     (cpp_dec_float<200U,_int,_void> *)local_4c8);
                    pcVar26 = local_438;
                    if (iVar16 < 1) goto LAB_005cb4e5;
                  }
                  local_320._0_4_ = cpp_dec_float_finite;
                  local_320._4_4_ = 0x1c;
                  local_398._0_16_ = (undefined1  [16])0x0;
                  local_398._16_16_ = (undefined1  [16])0x0;
                  local_378 = (undefined1  [16])0x0;
                  local_368 = (undefined1  [16])0x0;
                  local_358 = (undefined1  [16])0x0;
                  local_348 = (undefined1  [16])0x0;
                  local_338 = SUB1613((undefined1  [16])0x0,0);
                  uStack_32b = 0;
                  iStack_328 = 0;
                  bStack_324 = false;
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
                  if ((cpp_dec_float<200U,_int,_void> *)local_398 != local_438) {
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_398;
                    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                      (pcVar28->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                      pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_328 = iStack_278;
                    bStack_324 = bStack_274;
                    local_320._0_4_ = (fpclass_type)local_270;
                    local_320._4_4_ = local_270._4_4_;
                    pcVar26 = local_438;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar26);
                  goto LAB_005cb81d;
                }
              }
            }
          }
        }
        else {
          iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_428,
                              (cpp_dec_float<200U,_int,_void> *)local_4c8);
          pnVar34 = local_440;
          if (iVar16 < 1) goto LAB_005cb0e0;
          bVar11 = false;
          if (((fpclass_type)local_3b0 != cpp_dec_float_NaN) &&
             (local_268.fpclass != cpp_dec_float_NaN)) {
            iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_428,&local_268);
            bVar11 = 0 < iVar16;
          }
          pcVar26 = &local_268;
          if (bVar11) {
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_428;
          }
          piVar17 = &local_268.exp;
          if (bVar11) {
            piVar17 = &iStack_3b8;
          }
          pcVar28 = &local_268;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar28->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar26 + ((ulong)bVar35 * -2 + 1) * 4);
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          local_268.exp = *piVar17;
          pbVar14 = &local_268.neg;
          if (bVar11) {
            pbVar14 = abStack_3b4;
          }
          local_268.neg = *pbVar14;
          uVar36 = CONCAT44((int)((uint)bVar11 << 0x1f) >> 0x1f,(int)((uint)bVar11 << 0x1f) >> 0x1f)
          ;
          local_268._120_8_ = ~uVar36 & local_268._120_8_ | local_3b0 & uVar36;
          pnVar20 = (pointer)((long)local_300 + (long)iVar12 * 0x80);
          puVar23 = (undefined4 *)local_138;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *puVar23 = (pnVar20->m_backend).data._M_elems[0];
            pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar35 * -2 + 1) * 4);
            puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
          }
          iStack_c8 = (((pointer)((long)local_300 + (long)iVar12 * 0x80))->m_backend).exp;
          bStack_c4 = (((pointer)((long)local_300 + (long)iVar12 * 0x80))->m_backend).neg;
          local_c0._0_4_ = (((pointer)((long)local_300 + (long)iVar12 * 0x80))->m_backend).fpclass;
          local_c0._4_4_ = (((pointer)((long)local_300 + (long)iVar12 * 0x80))->m_backend).prec_elem
          ;
          ::soplex::infinity::__tls_init();
          local_450._0_4_ = cpp_dec_float_finite;
          local_450._4_4_ = 0x1c;
          local_4c8._0_16_ = (undefined1  [16])0x0;
          local_4c8._16_16_ = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = (undefined1  [16])0x0;
          local_468 = SUB1613((undefined1  [16])0x0,0);
          uStack_45b = 0;
          iStack_458 = 0;
          bStack_454 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4c8,(double)local_158);
          if (((fpclass_type)local_c0 != cpp_dec_float_NaN) &&
             ((fpclass_type)local_450 != cpp_dec_float_NaN)) {
            local_318 = (double)CONCAT44(local_318._4_4_,iVar12);
            iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_138,
                                (cpp_dec_float<200U,_int,_void> *)local_4c8);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_398;
            if (iVar16 < 1) goto LAB_005cb37f;
            pcVar28 = &local_3a8[iVar12].m_backend;
            local_450._0_4_ = cpp_dec_float_finite;
            local_450._4_4_ = 0x1c;
            local_4c8._0_16_ = (undefined1  [16])0x0;
            local_4c8._16_16_ = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = (undefined1  [16])0x0;
            local_468 = SUB1613((undefined1  [16])0x0,0);
            uStack_45b = 0;
            iStack_458 = 0;
            bStack_454 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_4c8 == pcVar28) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4c8,
                         (cpp_dec_float<200U,_int,_void> *)local_138);
              if (local_4c8._0_4_ != 0 || (fpclass_type)local_450 != cpp_dec_float_finite) {
                bStack_454 = (bool)(bStack_454 ^ 1);
              }
            }
            else {
              puVar27 = (uint *)local_138;
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar31->data)._M_elems[0] = *puVar27;
                puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              iStack_458 = iStack_c8;
              bStack_454 = bStack_c4;
              local_450._0_4_ = (fpclass_type)local_c0;
              local_450._4_4_ = local_c0._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_4c8,pcVar28);
            }
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
            puVar27 = (uint *)local_2e8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar27 = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
            }
            iStack_278 = iStack_458;
            bStack_274 = bStack_454;
            local_270._0_4_ = (fpclass_type)local_450;
            local_270._4_4_ = local_450._4_4_;
            iVar12 = local_318._0_4_;
            if ((fpclass_type)local_450 == cpp_dec_float_NaN) {
LAB_005cb538:
              local_320._0_4_ = cpp_dec_float_finite;
              local_320._4_4_ = 0x1c;
              local_398._0_16_ = (undefined1  [16])0x0;
              local_398._16_16_ = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = (undefined1  [16])0x0;
              local_338 = SUB1613((undefined1  [16])0x0,0);
              uStack_32b = 0;
              iStack_328 = 0;
              bStack_324 = false;
              if (pcVar26 == local_438) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (pcVar26,(cpp_dec_float<200U,_int,_void> *)local_2e8);
                if (local_398._0_4_ != 0 || (fpclass_type)local_320 != cpp_dec_float_finite) {
                  bStack_324 = (bool)(bStack_324 ^ 1);
                }
              }
              else {
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
                pcVar31 = pcVar26;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                iStack_328 = iStack_278;
                bStack_324 = bStack_274;
                local_320._0_4_ = (fpclass_type)local_270;
                local_320._4_4_ = local_270._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (pcVar26,local_438);
              }
LAB_005cb81d:
              local_450._0_4_ = cpp_dec_float_finite;
              local_450._4_4_ = 0x1c;
              local_4c8._0_16_ = (undefined1  [16])0x0;
              local_4c8._16_16_ = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_488 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              local_468 = SUB1613((undefined1  [16])0x0,0);
              uStack_45b = 0;
              iStack_458 = 0;
              bStack_454 = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)local_4c8,
                         (cpp_dec_float<200U,_int,_void> *)local_398,
                         (cpp_dec_float<200U,_int,_void> *)local_428);
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_428;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar28->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
              }
              iStack_3b8 = iStack_458;
              abStack_3b4[0] = bStack_454;
              local_3b0 = local_450;
              iVar12 = local_318._0_4_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4c8,0,(type *)0x0);
              iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                  (cpp_dec_float<200U,_int,_void> *)local_4c8);
              if (iVar16 < 0) goto LAB_005cb538;
              pcVar28 = local_438;
              pcVar31 = pcVar26;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              iStack_328 = (this->fastDelta).m_backend.exp;
              bStack_324 = (this->fastDelta).m_backend.neg;
              local_320._0_4_ = (this->fastDelta).m_backend.fpclass;
              local_320._4_4_ = (this->fastDelta).m_backend.prec_elem;
              if ((fpclass_type)local_320 != cpp_dec_float_finite || local_398._0_4_ != 0) {
                bStack_324 = (bool)(bStack_324 ^ 1);
              }
LAB_005cb4e5:
              bStack_454 = false;
              iStack_458 = 0;
              uStack_45b = 0;
              local_468 = SUB1613((undefined1  [16])0x0,0);
              local_450._0_4_ = cpp_dec_float_finite;
              local_450._4_4_ = 0x1c;
              local_478 = (undefined1  [16])0x0;
              local_488 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_4c8._16_16_ = (undefined1  [16])0x0;
              local_4c8._0_16_ = (undefined1  [16])0x0;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)local_4c8,pcVar26,
                         (cpp_dec_float<200U,_int,_void> *)local_428);
              puVar27 = (uint *)local_4c8;
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_428;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar26->data)._M_elems[0] = *puVar27;
                puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
              }
              iStack_3b8 = iStack_458;
              abStack_3b4[0] = bStack_454;
              local_3b0 = local_450;
            }
            local_3b0._0_4_ = (fpclass_type)local_450;
            if (((fpclass_type)local_3b0 != cpp_dec_float_NaN) && (local_170 != cpp_dec_float_NaN))
            {
              iStack_3b8 = iStack_458;
              abStack_3b4[0] = bStack_454;
              local_3b0 = local_450;
              iVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_428,
                                  (cpp_dec_float<200U,_int,_void> *)local_1e8);
              if (0 < iVar16) {
                puVar23 = (undefined4 *)local_428;
                puVar25 = (undefined4 *)local_1e8;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  *puVar25 = *puVar23;
                  puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
                  puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
                }
                iStack_178 = iStack_3b8;
                bStack_174 = abStack_3b4[0];
                local_170 = (fpclass_type)local_3b0;
                iStack_16c = local_3b0._4_4_;
                local_444 = iVar12;
              }
            }
          }
        }
LAB_005cb37f:
        piVar18 = (int *)((long)piVar18 + (long)local_2f8);
      } while (piVar18 < local_430);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    local_158 = update;
    lVar13 = (long)(int)((ulong)((long)(update->
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_3a8)
                        >> 7);
    if (lVar13 < 1) {
      local_444 = -1;
    }
    else {
      local_2f8 = pnVar34 + lVar13;
      local_430 = &this->epsilon;
      local_168 = *(double *)(in_FS_OFFSET + -8);
      uStack_160 = 0;
      local_318 = -*(double *)(in_FS_OFFSET + -8);
      uStack_310 = 0x8000000000000000;
      local_438 = &(this->fastDelta).m_backend;
      local_300 = &(((pointer)local_300)->m_backend).fpclass;
      local_308 = &(((pointer)local_308)->m_backend).fpclass;
      local_444 = -1;
      lVar33 = 0;
      lVar19 = 0;
      lVar13 = 0;
      piVar17 = piVar18;
      do {
        this_00 = (cpp_dec_float<200u,int,void> *)((long)&(pnVar34->m_backend).data + lVar19);
        pcVar21 = this_00;
        puVar23 = (undefined4 *)local_428;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar23 = *(undefined4 *)pcVar21;
          pcVar21 = pcVar21 + (ulong)bVar35 * -8 + 4;
          puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
        }
        iStack_3b8 = *(int *)((long)&(pnVar34->m_backend).data + lVar19 + 0x70);
        abStack_3b4[0] = (bool)*(byte *)((long)&(pnVar34->m_backend).data + lVar19 + 0x74);
        local_3b0 = *(ulong *)((long)&(pnVar34->m_backend).data + lVar19 + 0x78);
        piVar18 = piVar17;
        if ((int)local_3b0 != 2) {
          local_450._0_4_ = cpp_dec_float_finite;
          local_450._4_4_ = 0x1c;
          local_4c8._0_16_ = (undefined1  [16])0x0;
          local_4c8._16_16_ = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = (undefined1  [16])0x0;
          local_468 = SUB1613((undefined1  [16])0x0,0);
          uStack_45b = 0;
          iStack_458 = 0;
          bStack_454 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4c8,0.0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_428,
                              (cpp_dec_float<200U,_int,_void> *)local_4c8);
          pnVar34 = local_440;
          if (iVar12 != 0) goto LAB_005cbb08;
          goto LAB_005cc822;
        }
LAB_005cbb08:
        pnVar22 = local_430;
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        }
        bStack_454 = (this->epsilon).m_backend.neg;
        iStack_458 = (this->epsilon).m_backend.exp;
        fVar4 = (this->epsilon).m_backend.fpclass;
        iVar9 = (this->epsilon).m_backend.prec_elem;
        local_450._0_4_ = fVar4;
        local_450._4_4_ = iVar9;
        if (local_4c8._0_4_ != 0 || fVar4 != cpp_dec_float_finite) {
          bStack_454 = (bool)(bStack_454 ^ 1);
        }
        if (((fVar4 != cpp_dec_float_NaN) && ((fpclass_type)local_3b0 != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_428,
                                (cpp_dec_float<200U,_int,_void> *)local_4c8), -1 < iVar12)) {
          pnVar22 = local_430;
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_398;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
          }
          iStack_328 = (this->epsilon).m_backend.exp;
          bStack_324 = (this->epsilon).m_backend.neg;
          fVar1 = (this->epsilon).m_backend.fpclass;
          iVar2 = (this->epsilon).m_backend.prec_elem;
          local_320._0_4_ = fVar1;
          local_320._4_4_ = iVar2;
          if ((fVar1 != cpp_dec_float_NaN && (fpclass_type)local_3b0 != cpp_dec_float_NaN) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_428,
                                  (cpp_dec_float<200U,_int,_void> *)local_398), iVar12 < 1)) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_00,0.0);
            pnVar34 = local_440;
            goto LAB_005cc822;
          }
        }
        piVar18 = piVar17 + 1;
        *piVar17 = (int)lVar13;
        if (local_39c == LEAVE) {
          if (this->iscoid == true) {
            pSVar6 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar12 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat)->data[lVar13];
          }
          else {
            pSVar6 = (this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar12 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat)->data[lVar13];
          }
          pnVar34 = local_440;
          if (0 < iVar12) goto LAB_005cc822;
        }
        if ((char)local_2f0 != '\0') {
          pSVar6 = (this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar7 = (pSVar6->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < *(int *)((long)&(pSVar7->super_DataKey).info + lVar33)) {
            SPxColId::SPxColId((SPxColId *)local_4c8,
                               (SPxId *)((long)&(pSVar7->super_DataKey).info + lVar33));
            iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar6->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_4c8);
            pnVar34 = local_440;
            if ((pSVar6->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar12] == P_FIXED) goto LAB_005cc822;
          }
        }
        pnVar34 = local_440;
        pnVar22 = local_430;
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
        }
        iStack_458 = (this->epsilon).m_backend.exp;
        bStack_454 = (this->epsilon).m_backend.neg;
        local_450._0_4_ = (this->epsilon).m_backend.fpclass;
        local_450._4_4_ = (this->epsilon).m_backend.prec_elem;
        if (((fpclass_type)local_450 == cpp_dec_float_NaN ||
             (fpclass_type)local_3b0 == cpp_dec_float_NaN) ||
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_428,
                                (cpp_dec_float<200U,_int,_void> *)local_4c8), iVar12 < 1)) {
          pnVar22 = local_430;
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + (ulong)bVar35 * -8 + 4);
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
          }
          bStack_454 = (this->epsilon).m_backend.neg;
          iStack_458 = (this->epsilon).m_backend.exp;
          fVar5 = (this->epsilon).m_backend.fpclass;
          iVar10 = (this->epsilon).m_backend.prec_elem;
          local_450._0_4_ = fVar5;
          local_450._4_4_ = iVar10;
          if (local_4c8._0_4_ != 0 || fVar5 != cpp_dec_float_finite) {
            bStack_454 = (bool)(bStack_454 ^ 1);
          }
          if (((fVar5 != cpp_dec_float_NaN) && ((fpclass_type)local_3b0 != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_428,
                                  (cpp_dec_float<200U,_int,_void> *)local_4c8), pnVar34 = local_440,
             iVar12 < 0)) {
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_428;
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
            for (lVar15 = 0x1c; pnVar34 = local_440, lVar15 != 0; lVar15 = lVar15 + -1) {
              (pcVar28->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
            }
            iStack_458 = iStack_3b8;
            bStack_454 = abStack_3b4[0];
            local_450 = local_3b0;
            if (local_4c8._0_4_ != 0 || (int)local_3b0 != 0) {
              bStack_454 = (bool)(abStack_3b4[0] ^ 1);
            }
            puVar27 = local_268.data._M_elems + 1;
            if ((((int)local_3b0 == 2) || (local_268.fpclass == cpp_dec_float_NaN)) ||
               (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_4c8,&local_268),
               iVar12 < 1)) {
              puVar24 = puVar27;
              puVar29 = (uint *)local_398;
              for (lVar15 = 0x1b; iVar12 = local_268.exp, bVar32 = local_268.neg,
                  uVar36 = local_268._120_8_, lVar15 != 0; lVar15 = lVar15 + -1) {
                *puVar29 = *puVar24;
                puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
                puVar29 = puVar29 + (ulong)bVar35 * -2 + 1;
              }
            }
            else {
              puVar23 = (undefined4 *)(local_428 + 4);
              puVar25 = (undefined4 *)local_398;
              for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
                *puVar25 = *puVar23;
                puVar23 = puVar23 + (ulong)bVar35 * -2 + 1;
                puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
              }
              local_268.data._M_elems[0] = local_428._0_4_;
              iVar12 = iStack_3b8;
              bVar32 = ((int)local_3b0 != 0 || local_428._0_4_ != 0) ^ abStack_3b4[0];
              uVar36 = local_3b0;
            }
            puVar24 = (uint *)local_398;
            for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar27 = *puVar24;
              puVar24 = puVar24 + (ulong)bVar35 * -2 + 1;
              puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
            }
            puVar23 = (undefined4 *)((long)local_308 + lVar19 + -0x78);
            puVar25 = puVar23;
            puVar30 = (undefined4 *)local_b8;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar30 = *puVar25;
              puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
              puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
            }
            iStack_48 = puVar23[0x1c];
            bStack_44 = *(bool *)(puVar23 + 0x1d);
            local_40 = *(undefined8 *)(puVar23 + 0x1e);
            local_268.exp = iVar12;
            local_268.neg = (bool)bVar32;
            local_268._120_8_ = uVar36;
            ::soplex::infinity::__tls_init();
            local_450._0_4_ = cpp_dec_float_finite;
            local_450._4_4_ = 0x1c;
            local_4c8._0_16_ = (undefined1  [16])0x0;
            local_4c8._16_16_ = (undefined1  [16])0x0;
            local_4a8 = (undefined1  [16])0x0;
            local_498 = (undefined1  [16])0x0;
            local_488 = (undefined1  [16])0x0;
            local_478 = (undefined1  [16])0x0;
            local_468 = SUB1613((undefined1  [16])0x0,0);
            uStack_45b = 0;
            iStack_458 = 0;
            bStack_454 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_4c8,local_168);
            if (((fpclass_type)local_40 != cpp_dec_float_NaN) &&
               ((fpclass_type)local_450 != cpp_dec_float_NaN)) {
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_b8,
                                  (cpp_dec_float<200U,_int,_void> *)local_4c8);
              if (iVar12 < 0) {
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3a8->m_backend + lVar19);
                local_450._0_4_ = cpp_dec_float_finite;
                local_450._4_4_ = 0x1c;
                local_4c8._0_16_ = (undefined1  [16])0x0;
                local_4c8._16_16_ = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = (undefined1  [16])0x0;
                local_468 = SUB1613((undefined1  [16])0x0,0);
                uStack_45b = 0;
                iStack_458 = 0;
                bStack_454 = false;
                if (pcVar26 == (cpp_dec_float<200U,_int,_void> *)local_4c8) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4c8,
                             (cpp_dec_float<200U,_int,_void> *)local_b8);
                  if (local_4c8._0_4_ != 0 || (fpclass_type)local_450 != cpp_dec_float_finite) {
                    bStack_454 = (bool)(bStack_454 ^ 1);
                  }
                }
                else {
                  puVar27 = (uint *)local_b8;
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
                  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                    (pcVar28->data)._M_elems[0] = *puVar27;
                    puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_458 = iStack_48;
                  bStack_454 = bStack_44;
                  local_450._0_4_ = (fpclass_type)local_40;
                  local_450._4_4_ = local_40._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_4c8,pcVar26);
                }
                pcVar26 = local_438;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
                puVar27 = (uint *)local_2e8;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  *puVar27 = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                }
                iStack_278 = iStack_458;
                bStack_274 = bStack_454;
                local_270._0_4_ = (fpclass_type)local_450;
                local_270._4_4_ = local_450._4_4_;
                if ((fpclass_type)local_450 != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            ((cpp_dec_float<200U,_int,_void> *)local_4c8,0,(type *)0x0);
                  iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                      (cpp_dec_float<200U,_int,_void> *)local_4c8);
                  if (iVar12 < 1) goto LAB_005cc3bd;
                }
                local_320._0_4_ = cpp_dec_float_finite;
                local_320._4_4_ = 0x1c;
                local_398._0_16_ = (undefined1  [16])0x0;
                local_398._16_16_ = (undefined1  [16])0x0;
                local_378 = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = SUB1613((undefined1  [16])0x0,0);
                uStack_32b = 0;
                iStack_328 = 0;
                bStack_324 = false;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
                if ((cpp_dec_float<200U,_int,_void> *)local_398 != pcVar26) {
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)local_398;
                  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_328 = iStack_278;
                  bStack_324 = bStack_274;
                  local_320._0_4_ = (fpclass_type)local_270;
                  local_320._4_4_ = local_270._4_4_;
                  pcVar28 = pcVar26;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar28);
                goto LAB_005cc703;
              }
            }
          }
        }
        else {
          bVar11 = false;
          if (((fpclass_type)local_3b0 != cpp_dec_float_NaN) &&
             (local_268.fpclass != cpp_dec_float_NaN)) {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_428,&local_268);
            bVar11 = 0 < iVar12;
          }
          pcVar26 = &local_268;
          if (bVar11) {
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_428;
          }
          piVar17 = &local_268.exp;
          if (bVar11) {
            piVar17 = &iStack_3b8;
          }
          pbVar14 = &local_268.neg;
          if (bVar11) {
            pbVar14 = abStack_3b4;
          }
          pcVar28 = &local_268;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar28->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4);
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          }
          local_268.exp = *piVar17;
          local_268.neg = *pbVar14;
          uVar36 = CONCAT44((int)((uint)bVar11 << 0x1f) >> 0x1f,(int)((uint)bVar11 << 0x1f) >> 0x1f)
          ;
          local_268._120_8_ = ~uVar36 & local_268._120_8_ | local_3b0 & uVar36;
          puVar23 = (undefined4 *)((long)local_300 + lVar19 + -0x78);
          puVar25 = puVar23;
          puVar30 = (undefined4 *)local_138;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar30 = *puVar25;
            puVar25 = puVar25 + (ulong)bVar35 * -2 + 1;
            puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
          }
          iStack_c8 = puVar23[0x1c];
          bStack_c4 = *(bool *)(puVar23 + 0x1d);
          local_c0 = *(undefined8 *)(puVar23 + 0x1e);
          ::soplex::infinity::__tls_init();
          local_450._0_4_ = cpp_dec_float_finite;
          local_450._4_4_ = 0x1c;
          local_4c8._0_16_ = (undefined1  [16])0x0;
          local_4c8._16_16_ = (undefined1  [16])0x0;
          local_4a8 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          local_488 = (undefined1  [16])0x0;
          local_478 = (undefined1  [16])0x0;
          local_468 = SUB1613((undefined1  [16])0x0,0);
          uStack_45b = 0;
          iStack_458 = 0;
          bStack_454 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_4c8,local_318);
          if (((fpclass_type)local_c0 != cpp_dec_float_NaN) &&
             ((fpclass_type)local_450 != cpp_dec_float_NaN)) {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_138,
                                (cpp_dec_float<200U,_int,_void> *)local_4c8);
            if (0 < iVar12) {
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)&local_3a8->m_backend + lVar19);
              local_450._0_4_ = cpp_dec_float_finite;
              local_450._4_4_ = 0x1c;
              local_4c8._0_16_ = (undefined1  [16])0x0;
              local_4c8._16_16_ = (undefined1  [16])0x0;
              local_4a8 = (undefined1  [16])0x0;
              local_498 = (undefined1  [16])0x0;
              local_488 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              local_468 = SUB1613((undefined1  [16])0x0,0);
              uStack_45b = 0;
              iStack_458 = 0;
              bStack_454 = false;
              if (pcVar26 == (cpp_dec_float<200U,_int,_void> *)local_4c8) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_4c8,
                           (cpp_dec_float<200U,_int,_void> *)local_138);
                if (local_4c8._0_4_ != 0 || (fpclass_type)local_450 != cpp_dec_float_finite) {
                  bStack_454 = (bool)(bStack_454 ^ 1);
                }
              }
              else {
                puVar27 = (uint *)local_138;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar28->data)._M_elems[0] = *puVar27;
                  puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                }
                iStack_458 = iStack_c8;
                bStack_454 = bStack_c4;
                local_450._0_4_ = (fpclass_type)local_c0;
                local_450._4_4_ = local_c0._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_4c8,pcVar26);
              }
              pcVar28 = local_438;
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
              puVar27 = (uint *)local_2e8;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                *puVar27 = (pcVar26->data)._M_elems[0];
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar35 * -8 + 4)
                ;
                puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
              }
              iStack_278 = iStack_458;
              bStack_274 = bStack_454;
              local_270._0_4_ = (fpclass_type)local_450;
              local_270._4_4_ = local_450._4_4_;
              if ((fpclass_type)local_450 == cpp_dec_float_NaN) {
LAB_005cc413:
                local_320._0_4_ = cpp_dec_float_finite;
                local_320._4_4_ = 0x1c;
                local_398._0_16_ = (undefined1  [16])0x0;
                local_398._16_16_ = (undefined1  [16])0x0;
                local_378 = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = SUB1613((undefined1  [16])0x0,0);
                uStack_32b = 0;
                iStack_328 = 0;
                bStack_324 = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_398 == pcVar28) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_398,
                             (cpp_dec_float<200U,_int,_void> *)local_2e8);
                  if (local_398._0_4_ != 0 || (fpclass_type)local_320 != cpp_dec_float_finite) {
                    bStack_324 = (bool)(bStack_324 ^ 1);
                  }
                }
                else {
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)local_398;
                  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_328 = iStack_278;
                  bStack_324 = bStack_274;
                  local_320._0_4_ = (fpclass_type)local_270;
                  local_320._4_4_ = local_270._4_4_;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar28);
                }
LAB_005cc703:
                local_450._0_4_ = cpp_dec_float_finite;
                local_450._4_4_ = 0x1c;
                local_4c8._0_16_ = (undefined1  [16])0x0;
                local_4c8._16_16_ = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_478 = (undefined1  [16])0x0;
                local_468 = SUB1613((undefined1  [16])0x0,0);
                uStack_45b = 0;
                iStack_458 = 0;
                bStack_454 = false;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)local_4c8,
                           (cpp_dec_float<200U,_int,_void> *)local_398,
                           (cpp_dec_float<200U,_int,_void> *)local_428);
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_4c8;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_428;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar28->data)._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                }
                iStack_3b8 = iStack_458;
                abStack_3b4[0] = bStack_454;
                local_3b0 = local_450;
                pnVar34 = local_440;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_4c8,0,(type *)0x0);
                iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                                    (cpp_dec_float<200U,_int,_void> *)local_4c8);
                if (iVar12 < 0) goto LAB_005cc413;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_398;
                pcVar31 = pcVar26;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                iStack_328 = (this->fastDelta).m_backend.exp;
                bStack_324 = (this->fastDelta).m_backend.neg;
                local_320._0_4_ = (this->fastDelta).m_backend.fpclass;
                local_320._4_4_ = (this->fastDelta).m_backend.prec_elem;
                if ((fpclass_type)local_320 != cpp_dec_float_finite || local_398._0_4_ != 0) {
                  bStack_324 = (bool)(bStack_324 ^ 1);
                }
LAB_005cc3bd:
                bStack_454 = false;
                iStack_458 = 0;
                uStack_45b = 0;
                local_468 = SUB1613((undefined1  [16])0x0,0);
                local_450._0_4_ = cpp_dec_float_finite;
                local_450._4_4_ = 0x1c;
                local_478 = (undefined1  [16])0x0;
                local_488 = (undefined1  [16])0x0;
                local_498 = (undefined1  [16])0x0;
                local_4a8 = (undefined1  [16])0x0;
                local_4c8._16_16_ = (undefined1  [16])0x0;
                local_4c8._0_16_ = (undefined1  [16])0x0;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((cpp_dec_float<200U,_int,_void> *)local_4c8,pcVar26,
                           (cpp_dec_float<200U,_int,_void> *)local_428);
                puVar27 = (uint *)local_4c8;
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_428;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar26->data)._M_elems[0] = *puVar27;
                  puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                }
                iStack_3b8 = iStack_458;
                abStack_3b4[0] = bStack_454;
                local_3b0 = local_450;
              }
              local_3b0._0_4_ = (fpclass_type)local_450;
              if ((((fpclass_type)local_3b0 != cpp_dec_float_NaN) &&
                  (local_170 != cpp_dec_float_NaN)) &&
                 (iStack_3b8 = iStack_458, abStack_3b4[0] = bStack_454, local_3b0 = local_450,
                 iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_428,
                                     (cpp_dec_float<200U,_int,_void> *)local_1e8), 0 < iVar12)) {
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_428;
                puVar27 = (uint *)local_1e8;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  *puVar27 = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar35 * -8 + 4);
                  puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
                }
                iStack_178 = iStack_3b8;
                bStack_174 = abStack_3b4[0];
                local_170 = (fpclass_type)local_3b0;
                iStack_16c = local_3b0._4_4_;
                local_444 = (int)lVar13;
              }
            }
          }
        }
LAB_005cc822:
        lVar13 = lVar13 + 1;
        lVar33 = lVar33 + 8;
        pnVar20 = (pointer)((long)&pnVar34[1].m_backend.data + lVar19);
        lVar19 = lVar19 + 0x80;
        piVar17 = piVar18;
      } while (pnVar20 < local_2f8);
    }
    (local_158->thedelta).super_IdxSet.num =
         (int)((ulong)((long)piVar18 - (long)(local_158->thedelta).super_IdxSet.idx) >> 2);
    (local_158->thedelta).setupStatus = true;
  }
  puVar27 = (uint *)local_1e8;
  pnVar22 = local_148;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = *puVar27;
    puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  (local_148->m_backend).exp = iStack_178;
  (local_148->m_backend).neg = bStack_174;
  (local_148->m_backend).fpclass = local_170;
  (local_148->m_backend).prec_elem = iStack_16c;
  pcVar26 = &local_268;
  pnVar22 = local_140;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
    pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar35 * -2 + 1) * 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  (local_140->m_backend).exp = local_268.exp;
  (local_140->m_backend).neg = local_268.neg;
  (local_140->m_backend).fpclass = local_268.fpclass;
  (local_140->m_backend).prec_elem = local_268.prec_elem;
  return local_444;
}

Assistant:

int SPxFastRT<R>::minDelta(
   R& val,
   R& maxabs,
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = (this->m_type == SPxSolverBase<R>::LEAVE);
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;
         x = upd[i];

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse VectorBase<R> update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;


            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;

   return sel;
}